

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall tonk::SessionOutgoing::PostRetransmit(SessionOutgoing *this,bool *messageSent)

{
  ostringstream *this_00;
  undefined8 *puVar1;
  SiameseResult SVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  _func_int **pp_Var6;
  OutputWorker *this_01;
  OutgoingQueuedDatagram *datagram;
  uint uVar7;
  undefined1 *in_RDX;
  SiameseOriginalPacket original;
  SiameseOriginalPacket local_1c8;
  undefined1 local_1b8 [392];
  
  *in_RDX = 0;
  if ((messageSent[0x2a4] & 1U) == 0) {
    puVar1 = *(undefined8 **)(messageSent + 0x208);
    if (*(int *)(puVar1 + 1) < 4) {
      local_1b8._0_8_ = *puVar1;
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)puVar1[7],puVar1[8]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"PostRetransmit ignored before peer address is known",0x33);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    goto LAB_0014c6b2;
  }
  if (*(int *)(*(long *)(messageSent + 0x220) + 0x18) < 1) goto LAB_0014c6b2;
  SVar2 = siamese_encoder_retransmit(*(SiameseEncoder *)(messageSent + 0x2d0),&local_1c8);
  uVar7 = local_1c8.DataBytes;
  if (SVar2 != Siamese_Success) {
    if (SVar2 != Siamese_NeedMoreData) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_retransmit failed","");
      pp_Var6 = (_func_int **)operator_new(0x38);
      *pp_Var6 = (_func_int *)"SessionOutgoing::PostRetransmit";
      pp_Var6[1] = (_func_int *)(pp_Var6 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var6 + 1),local_1b8._0_8_,(char *)(local_1b8._0_8_ + local_1b8._8_8_)
                );
      *(undefined4 *)(pp_Var6 + 5) = 1;
      pp_Var6[6] = (_func_int *)(long)(int)SVar2;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var6;
      if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
        return (Result)(ErrorResult *)this;
      }
      operator_delete((void *)local_1b8._0_8_);
      return (Result)(ErrorResult *)this;
    }
    goto LAB_0014c6b2;
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(messageSent + 8));
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  datagram = (OutgoingQueuedDatagram *)
             pktalloc::Allocator::Allocate((Allocator *)(messageSent + 0x30),uVar7 + 0x3f);
  pthread_mutex_unlock((pthread_mutex_t *)(messageSent + 8));
  if (datagram == (OutgoingQueuedDatagram *)0x0) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    local_1b8._8_8_ = 0;
    local_1b8[0x10] = (ostringstream)0x0;
    pp_Var6 = (_func_int **)operator_new(0x38);
    *pp_Var6 = (_func_int *)"Out of memory";
    pp_Var6[1] = (_func_int *)(pp_Var6 + 3);
    pp_Var6[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var6 + 3) = 0;
    *(undefined4 *)(pp_Var6 + 5) = 0;
    pp_Var6[6] = (_func_int *)0x10;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var6;
    return (Result)(ErrorResult *)this;
  }
  datagram->Next = (OutgoingQueuedDatagram *)0x0;
  datagram->NextWriteOffset = 0;
  datagram->CompressionSavings = 0;
  memcpy(datagram->Data,local_1c8.Data,(ulong)local_1c8.DataBytes);
  datagram->NextWriteOffset = local_1c8.DataBytes;
  if (messageSent[0x61a0] == true) {
    uVar4 = local_1c8.PacketNum - *(int *)(messageSent + 0x300);
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar5 = local_1c8.PacketNum - *(int *)(messageSent + 0x308);
    uVar4 = -uVar5;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (uVar4 < uVar7) {
      uVar4 = uVar7;
    }
    uVar7 = 2 - (uVar4 < 0x7f);
    if (0x7ffe < uVar4) goto LAB_0014c69e;
  }
  else {
LAB_0014c69e:
    uVar7 = 3;
  }
  sendQueuedDatagram((SessionOutgoing *)messageSent,datagram,uVar7,local_1c8.PacketNum);
  *in_RDX = 1;
LAB_0014c6b2:
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::PostRetransmit(bool& messageSent)
{
    messageSent = false;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRetransmit ignored before peer address is known");
        return Result::Success();
    }

    // If there is no space left:
    if (Deps.SenderControl->GetAvailableBytes() <= 0) {
        return Result::Success();
    }

    // Get the highest priority packet to retransmit from Siamese
    SiameseOriginalPacket original;
    const int retransmitResult = siamese_encoder_retransmit(
        FECEncoder,
        &original);
    // Note: The returned data is valid until siamese_encoder_ack(),
    // which is only called from this thread.

    // If there is no data to retransmit:
    if (retransmitResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    // If the Siamese call failed:
    if (retransmitResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRetransmit", "siamese_retransmit failed", ErrorType::Siamese, retransmitResult);
    }

    TONK_DEBUG_ASSERT(original.DataBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    /*
        It is not worth trying to embed retransmits with other outgoing data.

        Arguments against:

        (1) Complexity in protocol.
        (2) Complexity in decoder to make sure the data is processed in sequence.
        (3) Complexity to avoid extra delay in delivering the data.
        (4) Often times the original datagram was already max size and cannot
            be clustered anymore.
        (5) We already clustered messages into one big datagram when first sent
            so it's unlikely that we will gain advantage from more clustering.
        (6) Retransmits are even more rare than packet loss rate, so optimizing
            the bandwidth of these rare events is not going to move the needle.
    */

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + original.DataBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    datagram->Initialize();

#ifdef TONK_DETAILED_STATS
    datagram->Stats[Stats_RetransmitSent] += original.DataBytes;
#endif // TONK_DETAILED_STATS

    // Copy data into place
    memcpy(datagram->Data, original.Data, original.DataBytes);
    datagram->NextWriteOffset = original.DataBytes;

    // No need to shrink the queued datagram here because it's already sized for the data

    // Send datagram immediately
    sendQueuedDatagram(
        datagram,
        getPacketNumBytes(original.PacketNum),
        original.PacketNum);

    messageSent = true;

    return Result::Success();
}